

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result wabt::anon_unknown_1::CheckFuncTypeVarMatchesExplicit
                 (Location *loc,Module *module,FuncDeclaration *decl,Errors *errors)

{
  Var *var;
  Result RVar1;
  Result RVar2;
  FuncType *pFVar3;
  string *psVar4;
  char *pcVar5;
  int __c;
  Enum EVar6;
  Var *__s;
  Errors *in_R9;
  ErrorLevel local_54;
  string local_50;
  
  EVar6 = Ok;
  if (decl->has_func_type == true) {
    var = &decl->type_var;
    __s = var;
    pFVar3 = Module::GetFuncType(module,var);
    if (pFVar3 == (FuncType *)0x0) {
      if (((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish) ||
         (EVar6 = Ok,
         (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
         _M_impl.super__Vector_impl_data._M_finish)) {
        if ((decl->type_var).type_ == Index) {
          local_54 = Error;
          pcVar5 = Var::index(var,(char *)__s,__c);
          StringPrintf_abi_cxx11_(&local_50,"invalid func type index %u",(ulong)pcVar5 & 0xffffffff)
          ;
        }
        else {
          local_54 = Error;
          psVar4 = Var::name_abi_cxx11_(var);
          StringPrintf_abi_cxx11_
                    (&local_50,"expected func type identifier %s",(psVar4->_M_dataplus)._M_p);
        }
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                  ((vector<wabt::Error,std::allocator<wabt::Error>> *)errors,&local_54,loc,&local_50
                  );
        std::__cxx11::string::_M_dispose();
        EVar6 = Error;
      }
    }
    else {
      RVar1 = CheckTypes(loc,&(decl->sig).result_types,&(pFVar3->sig).result_types,"result",
                         (char *)errors,in_R9);
      RVar2 = CheckTypes(loc,&(decl->sig).param_types,&(pFVar3->sig).param_types,"argument",
                         (char *)errors,in_R9);
      EVar6 = (uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
    }
  }
  return (Result)EVar6;
}

Assistant:

Result CheckFuncTypeVarMatchesExplicit(const Location& loc,
                                       const Module& module,
                                       const FuncDeclaration& decl,
                                       Errors* errors) {
  Result result = Result::Ok;
  if (decl.has_func_type) {
    const FuncType* func_type = module.GetFuncType(decl.type_var);
    if (func_type) {
      result |=
          CheckTypes(loc, decl.sig.result_types, func_type->sig.result_types,
                     "function", "result", errors);
      result |=
          CheckTypes(loc, decl.sig.param_types, func_type->sig.param_types,
                     "function", "argument", errors);
    } else if (!(decl.sig.param_types.empty() &&
                 decl.sig.result_types.empty())) {
      // We want to check whether the function type at the explicit index
      // matches the given param and result types. If they were omitted then
      // they'll be resolved automatically (see
      // ResolveFuncTypeWithEmptySignature), but if they are provided then we
      // have to check. If we get here then the type var is invalid, so we
      // can't check whether they match.
      if (decl.type_var.is_index()) {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("invalid func type index %" PRIindex,
                                          decl.type_var.index()));
      } else {
        errors->emplace_back(ErrorLevel::Error, loc,
                             StringPrintf("expected func type identifier %s",
                                          decl.type_var.name().c_str()));
      }
      result = Result::Error;
    }
  }
  return result;
}